

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
TasGrid::GridSequence::cacheBasisValues<double>
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,GridSequence *this,double *x)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  int local_50;
  int local_4c;
  int i_1;
  int i;
  double this_x;
  double b;
  int j;
  allocator<std::vector<double,_std::allocator<double>_>_> local_22;
  undefined1 local_21;
  double *local_20;
  double *x_local;
  GridSequence *this_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cache;
  
  local_21 = 0;
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_20 = x;
  x_local = (double *)this;
  this_local = (GridSequence *)__return_storage_ptr__;
  ::std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_22);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__,(long)iVar2,&local_22);
  ::std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_22);
  for (b._0_4_ = 0; b._0_4_ < (this->super_BaseCanonicalGrid).num_dimensions; b._0_4_ = b._0_4_ + 1)
  {
    pvVar3 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)__return_storage_ptr__,(long)b._0_4_);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&this->max_levels,(long)b._0_4_);
    ::std::vector<double,_std::allocator<double>_>::resize(pvVar3,(long)(*pvVar4 + 1));
    this_x = 1.0;
    dVar1 = local_20[b._0_4_];
    pvVar3 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)__return_storage_ptr__,(long)b._0_4_);
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
    *pvVar5 = 1.0;
    for (local_4c = 0;
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&this->max_levels,(long)b._0_4_),
        local_4c < *pvVar4; local_4c = local_4c + 1) {
      pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&this->nodes,(long)local_4c);
      this_x = (dVar1 - *pvVar6) * this_x;
      pvVar3 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)__return_storage_ptr__,(long)b._0_4_);
      pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar3,(long)(local_4c + 1));
      *pvVar5 = this_x;
    }
    for (local_50 = 1;
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&this->max_levels,(long)b._0_4_),
        local_50 <= *pvVar4; local_50 = local_50 + 1) {
      pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&this->coeff,(long)local_50);
      dVar1 = *pvVar6;
      pvVar3 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)__return_storage_ptr__,(long)b._0_4_);
      pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_50);
      *pvVar5 = *pvVar5 / dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T>> cacheBasisValues(const T x[]) const{
        std::vector<std::vector<T>> cache(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            cache[j].resize(max_levels[j] + 1);
            T b = 1.0;
            T this_x = x[j];
            cache[j][0] = b;
            for(int i=0; i<max_levels[j]; i++){
                b *= (this_x - nodes[i]);
                cache[j][i+1] = b;
            }
            for(int i=1; i<=max_levels[j]; i++){
                cache[j][i] /= coeff[i];
            }
        }
        return cache;
    }